

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int channel_start(mixed_segment *segment)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  
  pvVar4 = segment->data;
  if (*(char *)((long)pvVar4 + 0xe0) != '\0') {
    lVar5 = 0;
    do {
      if (*(long *)((long)pvVar4 + lVar5 * 8) == 0) {
        mixed_err(0x16);
        return 0;
      }
      lVar5 = lVar5 + 1;
    } while (*(char *)((long)pvVar4 + 0xe0) != (char)lVar5);
  }
  bVar3 = *(byte *)((long)pvVar4 + 0xe1);
  bVar6 = bVar3 == 0;
  if (!bVar6) {
    if (*(long *)((long)pvVar4 + 0x70) != 0) {
      lVar5 = 0;
      do {
        if ((byte)(bVar3 - 1) == (char)lVar5) {
          bVar6 = true;
          goto LAB_001323f8;
        }
        lVar1 = lVar5 + 1;
        lVar2 = lVar5 * 8;
        lVar5 = lVar1;
      } while (*(long *)((long)pvVar4 + lVar2 + 0x78) != 0);
      bVar6 = bVar3 <= (byte)lVar1;
    }
    mixed_err(0x16);
  }
LAB_001323f8:
  return (uint)bVar6;
}

Assistant:

int channel_start(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  for(mixed_channel_t i=0; i<data->in_channels; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->out_channels; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}